

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strtok(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 *puVar1;
  sxu32 local_6c;
  void *pvStack_68;
  int nLen;
  char *zDup;
  char *zCur;
  char *zInput;
  sxi32 rc;
  int nMasklen;
  SyString sToken;
  char *zMask;
  strtok_aux_data *pAux;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 2) {
    puVar1 = (undefined8 *)jx9_context_peek_aux_data(pCtx);
    if (puVar1 == (undefined8 *)0x0) {
      jx9_result_bool(pCtx,0);
    }
    else {
      zInput._4_4_ = 0;
      sToken._8_8_ = (long)"PK\x01\x02" + 4;
      if (0 < nArg) {
        sToken._8_8_ = jx9_value_to_string(*apArg,(int *)((long)&zInput + 4));
      }
      if (zInput._4_4_ < 1) {
        jx9_context_free_chunk(pCtx,(void *)*puVar1);
        jx9_context_free_chunk(pCtx,puVar1);
        jx9_context_pop_aux_data(pCtx);
        jx9_result_bool(pCtx,0);
      }
      else {
        zInput._0_4_ = ExtractToken((char **)(puVar1 + 1),(char *)puVar1[2],(char *)sToken._8_8_,
                                    zInput._4_4_,(SyString *)&rc);
        if ((sxi32)zInput == 0) {
          jx9_result_string(pCtx,_rc,(int)sToken.zString);
        }
        else {
          jx9_context_free_chunk(pCtx,(void *)*puVar1);
          jx9_context_free_chunk(pCtx,puVar1);
          jx9_context_pop_aux_data(pCtx);
          jx9_result_bool(pCtx,0);
        }
      }
    }
  }
  else {
    zDup = jx9_value_to_string(*apArg,(int *)&local_6c);
    zCur = zDup;
    if ((int)local_6c < 1) {
      jx9_result_bool(pCtx,0);
    }
    else {
      sToken._8_8_ = jx9_value_to_string(apArg[1],(int *)((long)&zInput + 4));
      if (zInput._4_4_ < 1) {
        sToken._8_8_ = anon_var_dwarf_6011;
        zInput._4_4_ = 5;
      }
      zInput._0_4_ = ExtractToken(&zCur,zCur + (int)local_6c,(char *)sToken._8_8_,zInput._4_4_,
                                  (SyString *)&rc);
      if ((sxi32)zInput == 0) {
        jx9_result_string(pCtx,_rc,(int)sToken.zString);
        puVar1 = (undefined8 *)jx9_context_alloc_chunk(pCtx,0x18,1,0);
        if (puVar1 != (undefined8 *)0x0) {
          local_6c = local_6c - ((int)zCur - (int)zDup);
          if ((int)local_6c < 1) {
            jx9_context_free_chunk(pCtx,puVar1);
          }
          else {
            pvStack_68 = jx9_context_alloc_chunk(pCtx,local_6c + 1,1,0);
            if (pvStack_68 != (void *)0x0) {
              SyMemcpy(zCur,pvStack_68,local_6c);
              puVar1[1] = pvStack_68;
              *puVar1 = pvStack_68;
              puVar1[2] = (long)pvStack_68 + (long)(int)local_6c;
              jx9_context_push_aux_data(pCtx,puVar1);
            }
          }
        }
      }
      else {
        jx9_result_bool(pCtx,0);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_strtok(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	strtok_aux_data *pAux;
	const char *zMask;
	SyString sToken; 
	int nMasklen;
	sxi32 rc;
	if( nArg < 2 ){
		/* Extract top aux data */
		pAux = (strtok_aux_data *)jx9_context_peek_aux_data(pCtx);
		if( pAux == 0 ){
			/* No aux data, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		nMasklen = 0;
		zMask = ""; /* cc warning */
		if( nArg > 0 ){
			/* Extract the mask */
			zMask = jx9_value_to_string(apArg[0], &nMasklen);
		}
		if( nMasklen < 1 ){
			/* Invalid mask, return FALSE */
			jx9_context_free_chunk(pCtx, (void *)pAux->zDup);
			jx9_context_free_chunk(pCtx, pAux);
			(void)jx9_context_pop_aux_data(pCtx);
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Extract the token */
		rc = ExtractToken(&pAux->zIn, pAux->zEnd, zMask, nMasklen, &sToken);
		if( rc != SXRET_OK ){
			/* EOF , discard the aux data */
			jx9_context_free_chunk(pCtx, (void *)pAux->zDup);
			jx9_context_free_chunk(pCtx, pAux);
			(void)jx9_context_pop_aux_data(pCtx);
			jx9_result_bool(pCtx, 0);
		}else{
			/* Return the extracted token */
			jx9_result_string(pCtx, sToken.zString, (int)sToken.nByte);
		}
	}else{
		const char *zInput, *zCur;
		char *zDup;
		int nLen;
		/* Extract the raw input */
		zCur = zInput = jx9_value_to_string(apArg[0], &nLen);
		if( nLen < 1 ){
			/* Empty input, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Extract the mask */
		zMask = jx9_value_to_string(apArg[1], &nMasklen);
		if( nMasklen < 1 ){
			/* Set a default mask */
#define TOK_MASK " \n\t\r\f" 
			zMask = TOK_MASK;
			nMasklen = (int)sizeof(TOK_MASK) - 1;
#undef TOK_MASK
		}
		/* Extract a single token */
		rc = ExtractToken(&zInput, &zInput[nLen], zMask, nMasklen, &sToken);
		if( rc != SXRET_OK ){
			/* Empty input */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}else{
			/* Return the extracted token */
			jx9_result_string(pCtx, sToken.zString, (int)sToken.nByte);
		}
		/* Create our auxilliary data and copy the input */
		pAux = (strtok_aux_data *)jx9_context_alloc_chunk(pCtx, sizeof(strtok_aux_data), TRUE, FALSE);
		if( pAux ){
			nLen -= (int)(zInput-zCur);
			if( nLen < 1 ){
				jx9_context_free_chunk(pCtx, pAux);
				return JX9_OK;
			}
			/* Duplicate input */
			zDup = (char *)jx9_context_alloc_chunk(pCtx, (unsigned int)(nLen+1), TRUE, FALSE);
			if( zDup  ){
				SyMemcpy(zInput, zDup, (sxu32)nLen);
				/* Register the aux data */
				pAux->zDup = pAux->zIn = zDup;
				pAux->zEnd = &zDup[nLen];
				jx9_context_push_aux_data(pCtx, pAux);
			}
		}
	}
	return JX9_OK;
}